

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall
fmt::v11::detail::format_handler<char>::on_format_specs
          (format_handler<char> *this,int id,char *begin,char *end)

{
  buffered_context<char> *ctx;
  size_t *psVar1;
  appender out;
  locale_ref loc;
  loc_value value;
  loc_value value_00;
  loc_value value_01;
  loc_value value_02;
  loc_value value_03;
  loc_value value_04;
  write_int_arg<unsigned___int128> arg_00;
  ushort uVar2;
  basic_appender<char> out_00;
  basic_appender<char> out_01;
  format_specs specs;
  basic_appender<char> out_02;
  long lVar3;
  bool bVar4;
  arg_id_kind aVar5;
  char *pcVar6;
  ulong uVar7;
  write_int_arg<unsigned_int> arg_01;
  uint uVar8;
  locale_ref loc_00;
  uint32_or_64_or_128_t<long_long> abs_value;
  basic_appender<char> bVar9;
  basic_string_view<char> s;
  format_specs specs_00;
  write_int_arg<unsigned_long> arg_02;
  format_specs specs_01;
  basic_format_arg<fmt::v11::context> arg;
  undefined2 uVar10;
  undefined6 uVar11;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_c8;
  undefined4 uStack_b4;
  undefined8 uStack_b0;
  dynamic_format_specs<char> local_a8;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_78;
  type local_68;
  long local_58;
  long lStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  ctx = &this->ctx;
  get_arg<fmt::v11::context,int>
            ((basic_format_arg<fmt::v11::context> *)&local_78.string,(detail *)ctx,
             (context *)(ulong)(uint)id,(int)end);
  loc_00.locale_ = (void *)(ulong)local_68;
  if (local_68 == custom_type) {
    pcVar6 = (this->parse_ctx).fmt_.data_;
    (this->parse_ctx).fmt_.data_ = begin;
    psVar1 = &(this->parse_ctx).fmt_.size_;
    *psVar1 = (size_t)(pcVar6 + (*psVar1 - (long)begin));
    (*(code *)CONCAT62(local_78.int128_value._10_6_,local_78.int128_value._8_2_))
              (CONCAT44(local_78.long_long_value._4_4_,local_78.int_value),this,ctx);
    return (this->parse_ctx).fmt_.data_;
  }
  local_a8.precision_ref.name.size_ = 0;
  local_a8.width_ref.name.data_ = (char *)0x0;
  local_a8.width_ref.name.size_ = 0;
  local_a8.super_format_specs.super_basic_specs.data_._0_1_ = 0;
  local_a8.super_format_specs.super_basic_specs.data_._1_1_ = 0x80;
  local_a8.super_format_specs.super_basic_specs.data_._2_2_ = 0;
  local_a8.super_format_specs.super_basic_specs.fill_data_[0] = ' ';
  local_a8.super_format_specs.super_basic_specs.fill_data_[1] = '\0';
  local_a8.super_format_specs.super_basic_specs.fill_data_[2] = '\0';
  local_a8.super_format_specs.super_basic_specs.fill_data_[3] = '\0';
  local_a8.super_format_specs.width = 0;
  local_a8.super_format_specs.precision._0_1_ = -1;
  local_a8.super_format_specs.precision._1_1_ = -1;
  local_a8.super_format_specs.precision._2_1_ = -1;
  local_a8.super_format_specs.precision._3_1_ = -1;
  local_a8.precision_ref.name.data_ = (char *)0x0;
  pcVar6 = parse_format_specs<char>(begin,end,&local_a8,&this->parse_ctx,local_68);
  uVar2 = CONCAT11(local_a8.super_format_specs.super_basic_specs.data_._1_1_,
                   (undefined1)local_a8.super_format_specs.super_basic_specs.data_);
  uVar8 = CONCAT22(local_a8.super_format_specs.super_basic_specs.data_._2_2_,uVar2);
  if ((uVar2 & 0x3c0) != 0) {
    aVar5 = (uVar2 & 0xc0) >> 6;
    if (aVar5 != none) {
      local_a8.super_format_specs.width =
           get_dynamic_spec<fmt::v11::context>(aVar5,&local_a8.width_ref,ctx);
      uVar8 = CONCAT22(local_a8.super_format_specs.super_basic_specs.data_._2_2_,
                       CONCAT11(local_a8.super_format_specs.super_basic_specs.data_._1_1_,
                                (undefined1)local_a8.super_format_specs.super_basic_specs.data_));
    }
    aVar5 = uVar8 >> 8 & (name|index);
    if (aVar5 != none) {
      local_a8.super_format_specs.precision =
           get_dynamic_spec<fmt::v11::context>(aVar5,&local_a8.precision_ref,ctx);
    }
  }
  if (0xd < local_68 - int_type) {
    return pcVar6;
  }
  out.container = (this->ctx).out_.container;
  loc.locale_ = (this->ctx).loc_.locale_;
  uVar10 = (undefined2)local_c8._8_8_;
  uVar11 = (undefined6)((ulong)local_c8._8_8_ >> 0x10);
  switch(local_68) {
  case int_type:
    if ((local_a8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      local_c8.int_value = local_78.int_value;
      value.value_._20_4_ = uStack_b4;
      value.value_.type_ = 1;
      value.value_.value_.field_0.int128_value._8_2_ = uVar10;
      value.value_.value_.field_0.long_long_value = local_c8._0_8_;
      value.value_.value_.field_0.int128_value._10_6_ = uVar11;
      value.value_._24_8_ = uStack_b0;
      bVar4 = write_loc(out,value,&local_a8.super_format_specs,loc);
      if (bVar4) {
        return pcVar6;
      }
    }
    if (local_78.int_value < 0) {
      local_78.int_value = -local_78.int_value;
      uVar7 = 0x100002d00000000;
    }
    else {
      uVar7 = (ulong)*(uint *)((long)&DAT_0053c3f0 +
                              (ulong)((CONCAT11(local_a8.super_format_specs.super_basic_specs.data_.
                                                _1_1_,(undefined1)
                                                      local_a8.super_format_specs.super_basic_specs.
                                                      data_) & 0xc00) >> 8)) << 0x20;
    }
    arg_01 = (write_int_arg<unsigned_int>)(local_78.uint_value | uVar7);
    goto LAB_004de6c2;
  case uint_type:
    uVar8 = CONCAT22(local_a8.super_format_specs.super_basic_specs.data_._2_2_,
                     CONCAT11(local_a8.super_format_specs.super_basic_specs.data_._1_1_,
                              (undefined1)local_a8.super_format_specs.super_basic_specs.data_));
    if ((local_a8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      local_c8.int_value = local_78.int_value;
      value_03.value_._20_4_ = uStack_b4;
      value_03.value_.type_ = 2;
      value_03.value_.value_.field_0.int128_value._8_2_ = uVar10;
      value_03.value_.value_.field_0.long_long_value = local_c8._0_8_;
      value_03.value_.value_.field_0.int128_value._10_6_ = uVar11;
      value_03.value_._24_8_ = uStack_b0;
      bVar4 = write_loc(out,value_03,&local_a8.super_format_specs,loc);
      if (bVar4) {
        return pcVar6;
      }
      uVar8 = CONCAT22(local_a8.super_format_specs.super_basic_specs.data_._2_2_,
                       CONCAT11(local_a8.super_format_specs.super_basic_specs.data_._1_1_,
                                (undefined1)local_a8.super_format_specs.super_basic_specs.data_));
    }
    arg_01.prefix = *(uint *)((long)&DAT_0053c3f0 + (ulong)(uVar8 >> 8 & 0xc));
    arg_01.abs_value = local_78.int_value;
LAB_004de6c2:
    write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
              ((basic_appender<char>)out.container,arg_01,&local_a8.super_format_specs);
    break;
  case long_long_type:
    if (((local_a8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) &&
       (value_01.value_._20_4_ = uStack_b4, value_01.value_.type_ = 3,
       value_01.value_.value_.field_0.int128_value._8_2_ = uVar10,
       value_01.value_.value_.field_0.long_long_value =
            CONCAT44(local_78.long_long_value._4_4_,local_78.int_value),
       value_01.value_.value_.field_0.int128_value._10_6_ = uVar11,
       value_01.value_._24_8_ = uStack_b0,
       bVar4 = write_loc(out,value_01,&local_a8.super_format_specs,loc), bVar4)) {
      return pcVar6;
    }
    if (-1 < local_78._4_4_) {
LAB_004de4fa:
      uVar8 = CONCAT22(local_a8.super_format_specs.super_basic_specs.data_._2_2_,
                       CONCAT11(local_a8.super_format_specs.super_basic_specs.data_._1_1_,
                                (undefined1)local_a8.super_format_specs.super_basic_specs.data_));
      goto LAB_004de4fe;
    }
    bVar9.container = (buffer<char> *)-CONCAT44(local_78.long_long_value._4_4_,local_78.int_value);
    uVar7 = 0x100002d;
    goto LAB_004de50e;
  case ulong_long_type:
    value_02.value_.value_.field_0.long_long_value._4_4_ = local_78.long_long_value._4_4_;
    value_02.value_.value_.field_0.int_value = local_78.int_value;
    uVar8 = CONCAT22(local_a8.super_format_specs.super_basic_specs.data_._2_2_,
                     CONCAT11(local_a8.super_format_specs.super_basic_specs.data_._1_1_,
                              (undefined1)local_a8.super_format_specs.super_basic_specs.data_));
    if ((local_a8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      value_02.value_._20_4_ = uStack_b4;
      value_02.value_.type_ = 4;
      value_02.value_.value_.field_0.int128_value._8_2_ = uVar10;
      value_02.value_.value_.field_0.int128_value._10_6_ = uVar11;
      value_02.value_._24_8_ = uStack_b0;
      bVar4 = write_loc(out,value_02,&local_a8.super_format_specs,loc);
      if (bVar4) {
        return pcVar6;
      }
      goto LAB_004de4fa;
    }
LAB_004de4fe:
    bVar9.container = (buffer<char> *)CONCAT44(local_78.long_long_value._4_4_,local_78.int_value);
    uVar7 = (ulong)*(uint *)((long)&DAT_0053c3f0 + (ulong)(uVar8 >> 8 & 0xc));
LAB_004de50e:
    arg_02._8_8_ = &local_a8;
    arg_02.abs_value = uVar7;
    write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_long>
              ((detail *)out.container,bVar9,arg_02,(format_specs *)loc_00.locale_);
    break;
  case int128_type:
    lVar3 = CONCAT44(local_78.long_long_value._4_4_,local_78.int_value);
    uVar8 = CONCAT22(local_a8.super_format_specs.super_basic_specs.data_._2_2_,
                     CONCAT11(local_a8.super_format_specs.super_basic_specs.data_._1_1_,
                              (undefined1)local_a8.super_format_specs.super_basic_specs.data_));
    if ((local_a8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      value_00.value_._20_4_ = uStack_b4;
      value_00.value_.type_ = 5;
      value_00.value_.value_.field_0.int128_value._8_2_ = local_78.int128_value._8_2_;
      value_00.value_.value_.field_0.long_long_value = lVar3;
      value_00.value_.value_.field_0.int128_value._10_6_ = local_78.int128_value._10_6_;
      value_00.value_._24_8_ = uStack_b0;
      bVar4 = write_loc(out,value_00,&local_a8.super_format_specs,loc);
      if (bVar4) {
        return pcVar6;
      }
      uVar8 = CONCAT22(local_a8.super_format_specs.super_basic_specs.data_._2_2_,
                       CONCAT11(local_a8.super_format_specs.super_basic_specs.data_._1_1_,
                                (undefined1)local_a8.super_format_specs.super_basic_specs.data_));
    }
    if (-1 < local_78._10_6_) goto LAB_004de5f6;
    local_58 = -lVar3;
    lStack_50 = -(ulong)(lVar3 != 0) -
                CONCAT62(local_78.int128_value._10_6_,local_78.int128_value._8_2_);
    local_48 = 0x100002d;
    goto LAB_004de606;
  case uint128_type:
    value_04.value_.value_.field_0.long_long_value._4_4_ = local_78.long_long_value._4_4_;
    value_04.value_.value_.field_0.int_value = local_78.int_value;
    uVar8 = CONCAT22(local_a8.super_format_specs.super_basic_specs.data_._2_2_,
                     CONCAT11(local_a8.super_format_specs.super_basic_specs.data_._1_1_,
                              (undefined1)local_a8.super_format_specs.super_basic_specs.data_));
    if ((local_a8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      value_04.value_._20_4_ = uStack_b4;
      value_04.value_.type_ = 6;
      value_04.value_.value_.field_0.int128_value._8_2_ = local_78.int128_value._8_2_;
      value_04.value_.value_.field_0.int128_value._10_6_ = local_78.int128_value._10_6_;
      value_04.value_._24_8_ = uStack_b0;
      bVar4 = write_loc(out,value_04,&local_a8.super_format_specs,loc);
      if (bVar4) {
        return pcVar6;
      }
      uVar8 = CONCAT22(local_a8.super_format_specs.super_basic_specs.data_._2_2_,
                       CONCAT11(local_a8.super_format_specs.super_basic_specs.data_._1_1_,
                                (undefined1)local_a8.super_format_specs.super_basic_specs.data_));
    }
LAB_004de5f6:
    local_58 = CONCAT44(local_78.long_long_value._4_4_,local_78.int_value);
    lStack_50 = CONCAT62(local_78.int128_value._10_6_,local_78.int128_value._8_2_);
    local_48 = *(undefined4 *)((long)&DAT_0053c3f0 + (ulong)(uVar8 >> 8 & 0xc));
LAB_004de606:
    arg_00._20_4_ = uStack_44;
    arg_00.prefix = local_48;
    arg_00.abs_value._8_2_ = (short)lStack_50;
    arg_00.abs_value._0_8_ = local_58;
    arg_00.abs_value._10_6_ = (int6)((ulong)lStack_50 >> 0x10);
    arg_00._24_8_ = uStack_40;
    write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned__int128>
              ((basic_appender<char>)out.container,arg_00,&local_a8.super_format_specs);
    break;
  case bool_type:
    write<char,_fmt::v11::basic_appender<char>,_bool,_0>
              ((basic_appender<char>)out.container,local_78.bool_value,&local_a8.super_format_specs,
               loc);
    break;
  case char_type:
    write<char,fmt::v11::basic_appender<char>>
              ((basic_appender<char>)out.container,local_78.char_value,&local_a8.super_format_specs,
               loc);
    break;
  case float_type:
    out_01.container._1_1_ = local_a8.super_format_specs.super_basic_specs.data_._1_1_;
    out_01.container._0_1_ = (undefined1)local_a8.super_format_specs.super_basic_specs.data_;
    out_01.container._2_2_ = local_a8.super_format_specs.super_basic_specs.data_._2_2_;
    out_01.container._4_1_ = local_a8.super_format_specs.super_basic_specs.fill_data_[0];
    out_01.container._5_1_ = local_a8.super_format_specs.super_basic_specs.fill_data_[1];
    out_01.container._6_1_ = local_a8.super_format_specs.super_basic_specs.fill_data_[2];
    out_01.container._7_1_ = local_a8.super_format_specs.super_basic_specs.fill_data_[3];
    specs_01.super_basic_specs.fill_data_[0] = (undefined1)local_a8.super_format_specs.precision;
    specs_01.super_basic_specs.fill_data_[1] = local_a8.super_format_specs.precision._1_1_;
    specs_01.super_basic_specs.fill_data_[2] = local_a8.super_format_specs.precision._2_1_;
    specs_01.super_basic_specs.fill_data_[3] = local_a8.super_format_specs.precision._3_1_;
    specs_01.super_basic_specs.data_ = local_a8.super_format_specs.width;
    specs_01._8_8_ = loc.locale_;
    write<char,_fmt::v11::basic_appender<char>,_float,_0>
              ((detail *)out.container,out_01,local_78.float_value,specs_01,loc_00);
    break;
  case double_type:
    out_00.container._1_1_ = local_a8.super_format_specs.super_basic_specs.data_._1_1_;
    out_00.container._0_1_ = (undefined1)local_a8.super_format_specs.super_basic_specs.data_;
    out_00.container._2_2_ = local_a8.super_format_specs.super_basic_specs.data_._2_2_;
    out_00.container._4_1_ = local_a8.super_format_specs.super_basic_specs.fill_data_[0];
    out_00.container._5_1_ = local_a8.super_format_specs.super_basic_specs.fill_data_[1];
    out_00.container._6_1_ = local_a8.super_format_specs.super_basic_specs.fill_data_[2];
    out_00.container._7_1_ = local_a8.super_format_specs.super_basic_specs.fill_data_[3];
    specs_00.super_basic_specs.fill_data_[0] = (undefined1)local_a8.super_format_specs.precision;
    specs_00.super_basic_specs.fill_data_[1] = local_a8.super_format_specs.precision._1_1_;
    specs_00.super_basic_specs.fill_data_[2] = local_a8.super_format_specs.precision._2_1_;
    specs_00.super_basic_specs.fill_data_[3] = local_a8.super_format_specs.precision._3_1_;
    specs_00.super_basic_specs.data_ = local_a8.super_format_specs.width;
    specs_00._8_8_ = loc.locale_;
    write<char,_fmt::v11::basic_appender<char>,_double,_0>
              ((detail *)out.container,out_00,
               (double)CONCAT44(local_78.long_long_value._4_4_,local_78.int_value),specs_00,loc_00);
    break;
  case last_numeric_type:
    specs.super_basic_specs.data_._1_1_ = local_a8.super_format_specs.super_basic_specs.data_._1_1_;
    specs.super_basic_specs.data_._0_1_ =
         (undefined1)local_a8.super_format_specs.super_basic_specs.data_;
    specs.super_basic_specs.data_._2_2_ = local_a8.super_format_specs.super_basic_specs.data_._2_2_;
    specs.super_basic_specs.fill_data_[0] =
         local_a8.super_format_specs.super_basic_specs.fill_data_[0];
    specs.super_basic_specs.fill_data_[1] =
         local_a8.super_format_specs.super_basic_specs.fill_data_[1];
    specs.super_basic_specs.fill_data_[2] =
         local_a8.super_format_specs.super_basic_specs.fill_data_[2];
    specs.super_basic_specs.fill_data_[3] =
         local_a8.super_format_specs.super_basic_specs.fill_data_[3];
    specs.width = local_a8.super_format_specs.width;
    specs.precision = local_a8.super_format_specs.precision;
    write<char,_fmt::v11::basic_appender<char>,_long_double,_0>
              ((basic_appender<char>)out.container,
               (longdouble)
               CONCAT28(local_78.int128_value._8_2_,
                        CONCAT44(local_78.long_long_value._4_4_,local_78.int_value)),specs,loc);
    break;
  case cstring_type:
    out_02.container._4_4_ = local_78.long_long_value._4_4_;
    out_02.container._0_4_ = local_78.int_value;
    write<char,fmt::v11::basic_appender<char>>
              ((detail *)out.container,out_02,(char *)&local_a8,(format_specs *)loc.locale_,loc_00);
    break;
  case string_type:
    bVar9.container._4_4_ = local_78.long_long_value._4_4_;
    bVar9.container._0_4_ = local_78.int_value;
    s.data_._2_6_ = local_78.int128_value._10_6_;
    s.data_._0_2_ = local_78.int128_value._8_2_;
    s.size_ = (size_t)&local_a8;
    write<char,fmt::v11::basic_appender<char>>
              ((detail *)out.container,bVar9,s,(format_specs *)loc_00.locale_);
    break;
  case pointer_type:
    write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
              ((basic_appender<char>)out.container,
               CONCAT44(local_78.long_long_value._4_4_,local_78.int_value),
               &local_a8.super_format_specs);
  }
  return pcVar6;
}

Assistant:

auto on_format_specs(int id, const Char* begin, const Char* end)
      -> const Char* {
    auto arg = get_arg(ctx, id);
    // Not using a visitor for custom types gives better codegen.
    if (arg.format_custom(begin, parse_ctx, ctx)) return parse_ctx.begin();

    auto specs = dynamic_format_specs<Char>();
    begin = parse_format_specs(begin, end, specs, parse_ctx, arg.type());
    if (specs.dynamic()) {
      handle_dynamic_spec(specs.dynamic_width(), specs.width, specs.width_ref,
                          ctx);
      handle_dynamic_spec(specs.dynamic_precision(), specs.precision,
                          specs.precision_ref, ctx);
    }

    arg.visit(arg_formatter<Char>{ctx.out(), specs, ctx.locale()});
    return begin;
  }